

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O2

void random_init(RandomState *rs,double d)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  bool bVar5;
  
  uVar1 = 0x11090601;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    dVar4 = (double)(ulong)(uint)(1 << (sbyte)uVar1);
    uVar1 = uVar1 >> 8;
    d = d * 3.141592653589793 + 2.718281828459045;
    if ((ulong)dVar4 <= (ulong)d) {
      dVar4 = 0.0;
    }
    rs->gen[lVar3] = (long)dVar4 + (long)d;
  }
  rs->valid = 1;
  iVar2 = 10;
  while (bVar5 = iVar2 != 0, iVar2 = iVar2 + -1, bVar5) {
    lj_math_random_step(rs);
  }
  return;
}

Assistant:

static void random_init(RandomState *rs, double d)
{
  uint32_t r = 0x11090601;  /* 64-k[i] as four 8 bit constants. */
  int i;
  for (i = 0; i < 4; i++) {
    U64double u;
    uint32_t m = 1u << (r&255);
    r >>= 8;
    u.d = d = d * 3.14159265358979323846 + 2.7182818284590452354;
    if (u.u64 < m) u.u64 += m;  /* Ensure k[i] MSB of gen[i] are non-zero. */
    rs->gen[i] = u.u64;
  }
  rs->valid = 1;
  for (i = 0; i < 10; i++)
    lj_math_random_step(rs);
}